

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int finishpcallk(lua_State *L,CallInfo *ci)

{
  int iVar1;
  StkId oldtop;
  StkId func;
  int status;
  CallInfo *ci_local;
  lua_State *L_local;
  
  func._4_4_ = (int)(uint)ci->callstatus >> 10 & 7;
  if (func._4_4_ == 0) {
    func._4_4_ = 1;
  }
  else {
    iVar1 = (ci->u2).funcidx;
    L->allowhook = (byte)ci->callstatus & 1;
    oldtop = luaF_close(L,(StkId)((long)(L->stack).p + (long)iVar1),func._4_4_,1);
    luaD_seterrorobj(L,func._4_4_,oldtop);
    luaD_shrinkstack(L);
    ci->callstatus = ci->callstatus & 0xe3ff;
  }
  ci->callstatus = ci->callstatus & 0xffef;
  L->errfunc = (ci->u).c.old_errfunc;
  return func._4_4_;
}

Assistant:

static int finishpcallk (lua_State *L,  CallInfo *ci) {
  int status = getcistrecst(ci);  /* get original status */
  if (l_likely(status == LUA_OK))  /* no error? */
    status = LUA_YIELD;  /* was interrupted by an yield */
  else {  /* error */
    StkId func = restorestack(L, ci->u2.funcidx);
    L->allowhook = getoah(ci->callstatus);  /* restore 'allowhook' */
    func = luaF_close(L, func, status, 1);  /* can yield or raise an error */
    luaD_seterrorobj(L, status, func);
    luaD_shrinkstack(L);   /* restore stack size in case of overflow */
    setcistrecst(ci, LUA_OK);  /* clear original status */
  }
  ci->callstatus &= ~CIST_YPCALL;
  L->errfunc = ci->u.c.old_errfunc;
  /* if it is here, there were errors or yields; unlike 'lua_pcallk',
     do not change status */
  return status;
}